

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit)

{
  int local_5c;
  int local_58;
  byte local_51;
  int arg;
  byte local_41;
  CheckHandler local_40 [3];
  byte local_21;
  CheckHandler local_20;
  int local_18;
  int local_14;
  int limit_local;
  int start_local;
  BenchmarkImp *this_local;
  
  local_21 = 0;
  local_18 = limit;
  local_14 = start;
  _limit_local = this;
  if ((this->arg_count_ == -1) || (this->arg_count_ == 1)) {
    GetNullLogInstance();
  }
  else {
    CheckHandler::CheckHandler
              (&local_20,"arg_count_ == -1 || arg_count_ == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"DenseRange",0x1b2);
    local_21 = 1;
    CheckHandler::GetLog(&local_20);
  }
  if ((local_21 & 1) != 0) {
    CheckHandler::~CheckHandler(&local_20);
  }
  this->arg_count_ = 1;
  local_41 = 0;
  if (local_14 < 0) {
    CheckHandler::CheckHandler
              (local_40,"(start) >= (0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"DenseRange",0x1b4);
    local_41 = 1;
    CheckHandler::GetLog(local_40);
  }
  else {
    GetNullLogInstance();
  }
  if ((local_41 & 1) == 0) {
    local_51 = 0;
    if (local_18 < local_14) {
      CheckHandler::CheckHandler
                ((CheckHandler *)&arg,"(start) <= (limit)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                 ,"DenseRange",0x1b5);
      local_51 = 1;
      CheckHandler::GetLog((CheckHandler *)&arg);
    }
    else {
      GetNullLogInstance();
    }
    if ((local_51 & 1) == 0) {
      for (local_58 = local_14; local_58 <= local_18; local_58 = local_58 + 1) {
        local_5c = -1;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                   &local_58,&local_5c);
      }
      return;
    }
    CheckHandler::~CheckHandler((CheckHandler *)&arg);
  }
  CheckHandler::~CheckHandler(local_40);
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit) {
  CHECK(arg_count_ == -1 || arg_count_ == 1);
  arg_count_ = 1;
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg++) {
    args_.emplace_back(arg, -1);
  }
}